

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlNodePtr
xmlCtxtParseContentInternal
          (xmlParserCtxtPtr ctxt,xmlParserInputPtr input,int hasTextDecl,int buildTree)

{
  int *piVar1;
  xmlChar *pxVar2;
  _xmlNode *p_Var3;
  int iVar4;
  xmlNodePtr value;
  int *piVar5;
  xmlNodePtr pxVar6;
  
  if (buildTree == 0) {
    value = (xmlNodePtr)0x0;
  }
  else {
    value = xmlNewDocNode(ctxt->myDoc,(xmlNsPtr)0x0,(xmlChar *)"#root",(xmlChar *)0x0);
    if (value == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      pxVar6 = (xmlNodePtr)0x0;
      value = (xmlNodePtr)0x0;
      goto LAB_0013ce00;
    }
  }
  iVar4 = xmlCtxtPushInput(ctxt,input);
  if (iVar4 < 0) {
    pxVar6 = (xmlNodePtr)0x0;
    goto LAB_0013ce00;
  }
  nameNsPush(ctxt,(xmlChar *)"#root",(xmlChar *)0x0,(xmlChar *)0x0,0,0);
  spacePush(ctxt,-1);
  if (buildTree != 0) {
    nodePush(ctxt,value);
  }
  if (hasTextDecl != 0) {
    xmlDetectEncoding(ctxt);
    pxVar2 = ctxt->input->cur;
    if (((((*pxVar2 == '<') && (pxVar2[1] == '?')) && (pxVar2[2] == 'x')) &&
        ((pxVar2[3] == 'm' && (pxVar2[4] == 'l')))) &&
       (((ulong)pxVar2[5] < 0x21 && ((0x100002600U >> ((ulong)pxVar2[5] & 0x3f) & 1) != 0)))) {
      xmlParseTextDecl(ctxt);
      iVar4 = xmlStrEqual(ctxt->version,"1.0");
      if ((iVar4 != 0) && (iVar4 = xmlStrEqual(ctxt->input->version,"1.0"), iVar4 == 0)) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_VERSION_MISMATCH,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Version mismatch between document and entity\n");
      }
    }
  }
  xmlParseContentInternal(ctxt);
  if (ctxt->input->cur < ctxt->input->end) {
    xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
  }
  if (ctxt->wellFormed == 0) {
    if (ctxt->recovery == 0) goto LAB_0013cd8a;
    iVar4 = xmlCtxtIsCatastrophicError(ctxt);
    pxVar6 = (xmlNodePtr)0x0;
    if ((value != (xmlNodePtr)0x0) && (iVar4 == 0)) goto LAB_0013cd63;
  }
  else if (value == (xmlNodePtr)0x0) {
LAB_0013cd8a:
    pxVar6 = (xmlNodePtr)0x0;
  }
  else {
LAB_0013cd63:
    pxVar6 = value->children;
    value->children = (_xmlNode *)0x0;
    value->last = (_xmlNode *)0x0;
    for (p_Var3 = pxVar6; p_Var3 != (xmlNodePtr)0x0; p_Var3 = p_Var3->next) {
      p_Var3->parent = (_xmlNode *)0x0;
    }
  }
  do {
    ctxt->input->cur = ctxt->input->end;
    xmlParserShrink(ctxt);
    iVar4 = xmlParserGrow(ctxt);
  } while (0 < iVar4);
  if (buildTree != 0) {
    nodePop(ctxt);
  }
  namePop(ctxt);
  iVar4 = ctxt->spaceNr;
  if (0 < (long)iVar4) {
    ctxt->spaceNr = iVar4 + -1;
    piVar1 = ctxt->spaceTab + (long)iVar4 + -2;
    piVar5 = ctxt->spaceTab;
    if (iVar4 != 1) {
      piVar5 = piVar1;
    }
    ctxt->space = piVar5;
    piVar1[1] = -1;
  }
  xmlCtxtPopInput(ctxt);
LAB_0013ce00:
  xmlFreeNode(value);
  return pxVar6;
}

Assistant:

static xmlNodePtr
xmlCtxtParseContentInternal(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                            int hasTextDecl, int buildTree) {
    xmlNodePtr root = NULL;
    xmlNodePtr list = NULL;
    xmlChar *rootName = BAD_CAST "#root";
    int result;

    if (buildTree) {
        root = xmlNewDocNode(ctxt->myDoc, NULL, rootName, NULL);
        if (root == NULL) {
            xmlErrMemory(ctxt);
            goto error;
        }
    }

    if (xmlCtxtPushInput(ctxt, input) < 0)
        goto error;

    nameNsPush(ctxt, rootName, NULL, NULL, 0, 0);
    spacePush(ctxt, -1);

    if (buildTree)
        nodePush(ctxt, root);

    if (hasTextDecl) {
        xmlDetectEncoding(ctxt);

        /*
         * Parse a possible text declaration first
         */
        if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
            (IS_BLANK_CH(NXT(5)))) {
            xmlParseTextDecl(ctxt);
            /*
             * An XML-1.0 document can't reference an entity not XML-1.0
             */
            if ((xmlStrEqual(ctxt->version, BAD_CAST "1.0")) &&
                (!xmlStrEqual(ctxt->input->version, BAD_CAST "1.0"))) {
                xmlFatalErrMsg(ctxt, XML_ERR_VERSION_MISMATCH,
                               "Version mismatch between document and "
                               "entity\n");
            }
        }
    }

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur < ctxt->input->end)
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);

    if ((ctxt->wellFormed) ||
        ((ctxt->recovery) && (!xmlCtxtIsCatastrophicError(ctxt)))) {
        if (root != NULL) {
            xmlNodePtr cur;

            /*
             * Unlink newly created node list.
             */
            list = root->children;
            root->children = NULL;
            root->last = NULL;
            for (cur = list; cur != NULL; cur = cur->next)
                cur->parent = NULL;
        }
    }

    /*
     * Read the rest of the stream in case of errors. We want
     * to account for the whole entity size.
     */
    do {
        ctxt->input->cur = ctxt->input->end;
        xmlParserShrink(ctxt);
        result = xmlParserGrow(ctxt);
    } while (result > 0);

    if (buildTree)
        nodePop(ctxt);

    namePop(ctxt);
    spacePop(ctxt);

    xmlCtxtPopInput(ctxt);

error:
    xmlFreeNode(root);

    return(list);
}